

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::get_options
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *this)

{
  byte bVar1;
  Display DVar2;
  pointer pOVar3;
  long in_RSI;
  unique_ptr<MSX::Machine::Options,_std::default_delete<MSX::Machine::Options>_> local_20;
  __single_object options;
  ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *this_local;
  
  std::make_unique<MSX::Machine::Options,Configurable::OptionsType>((OptionsType *)&local_20);
  DVar2 = MachineTypes::ScanProducer::get_video_signal_configurable((ScanProducer *)(in_RSI + 0x30))
  ;
  pOVar3 = std::unique_ptr<MSX::Machine::Options,_std::default_delete<MSX::Machine::Options>_>::
           operator->(&local_20);
  (pOVar3->super_DisplayOption<MSX::Machine::Options>).output = DVar2;
  bVar1 = *(byte *)(in_RSI + 0x27de9);
  pOVar3 = std::unique_ptr<MSX::Machine::Options,_std::default_delete<MSX::Machine::Options>_>::
           operator->(&local_20);
  (pOVar3->super_QuickloadOption<MSX::Machine::Options>).quickload = (bool)(bVar1 & 1);
  std::unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>>::
  unique_ptr<MSX::Machine::Options,std::default_delete<MSX::Machine::Options>,void>
            ((unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>> *)this,
             &local_20);
  std::unique_ptr<MSX::Machine::Options,_std::default_delete<MSX::Machine::Options>_>::~unique_ptr
            (&local_20);
  return (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Reflection::Struct> get_options() final {
			auto options = std::make_unique<Options>(Configurable::OptionsType::UserFriendly);
			options->output = get_video_signal_configurable();
			options->quickload = allow_fast_tape_;
			return options;
		}